

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

double __thiscall
tetgenmesh::tetprismvol(tetgenmesh *this,double *p0,double *p1,double *p2,double *p3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double aheight;
  double bheight;
  
  dVar4 = p0[2] * p0[2] + *p0 * *p0 + p0[1] * p0[1];
  aheight = p1[2] * p1[2] + *p1 * *p1 + p1[1] * p1[1];
  bheight = p2[2] * p2[2] + *p2 * *p2 + p2[1] * p2[1];
  dVar1 = orient4d(p1,p2,p0,p3,p3,aheight,bheight,dVar4,0.0,
                   p3[2] * p3[2] + *p3 * *p3 + p3[1] * p3[1]);
  dVar2 = orient4d(p3,p2,p2,p0,p1,0.0,bheight,0.0,0.0,0.0);
  dVar3 = orient4d(p0,p2,p3,p0,p1,dVar4,bheight,0.0,0.0,0.0);
  dVar4 = orient4d(p2,p1,p0,p3,p1,bheight,aheight,dVar4,0.0,0.0);
  return ABS(dVar4) + ABS(dVar3) + ABS(dVar2) + ABS(dVar1);
}

Assistant:

REAL tetgenmesh::tetprismvol(REAL* p0, REAL* p1, REAL* p2, REAL* p3)
{
  REAL *p4, *p5, *p6, *p7;
  REAL w4, w5, w6, w7;
  REAL vol[4];

  p4 = p0;
  p5 = p1;
  p6 = p2;
  p7 = p3;

  // TO DO: these weights can be pre-calculated!
  w4 = dot(p0, p0);
  w5 = dot(p1, p1);
  w6 = dot(p2, p2);
  w7 = dot(p3, p3);

  // Calculate the volume of the tet-prism.
  vol[0] = orient4d(p5, p6, p4, p3, p7, w5, w6, w4, 0, w7);
  vol[1] = orient4d(p3, p6, p2, p0, p1,  0, w6,  0, 0,  0);
  vol[2] = orient4d(p4, p6, p3, p0, p1, w4, w6,  0, 0,  0);
  vol[3] = orient4d(p6, p5, p4, p3, p1, w6, w5, w4, 0,  0);

  return fabs(vol[0]) + fabs(vol[1]) + fabs(vol[2]) + fabs(vol[3]);
}